

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerTanh.cpp
# Opt level: O0

bool __thiscall tfs::DnnLayerTanh::runForward(DnnLayerTanh *this)

{
  double *pdVar1;
  long in_RDI;
  double dVar2;
  DNN_NUMERIC *output;
  DNN_NUMERIC *inEnd;
  DNN_NUMERIC *input;
  double *local_28;
  double *local_18;
  bool local_1;
  
  if ((*(long *)(in_RDI + 0x10) == 0) || (*(long *)(in_RDI + 0x40) == 0)) {
    local_1 = report_problem("Error",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerTanh.cpp"
                             ,"runForward",0x25,"Not configured correctly");
  }
  else {
    local_18 = TMatrix<double>::dataReadOnly(*(TMatrix<double> **)(in_RDI + 0x10));
    pdVar1 = TMatrix<double>::end(*(TMatrix<double> **)(in_RDI + 0x10));
    local_28 = TMatrix<double>::data(*(TMatrix<double> **)(in_RDI + 0x40));
    while (local_18 < pdVar1) {
      dVar2 = tanh(*local_18);
      *local_28 = dVar2;
      local_28 = local_28 + 1;
      local_18 = local_18 + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
    DnnLayerTanh::runForward( void ) {
        // -----------------------------------------------------------------------------------
        // Forward propagate while training
        // S = size of input data
        // m_in_a[S]
        // m_out_a[S]
        // ok: 24 May 2016
        // -----------------------------------------------------------------------------------
        if( m_in_a == 0 || m_out_a == 0 ) {
            return log_error( "Not configured correctly" );
        }
        const DNN_NUMERIC *        input = m_in_a->dataReadOnly();
        const DNN_NUMERIC * const  inEnd = m_in_a->end();     // A pointer just past the end of the input
        DNN_NUMERIC       *       output = m_out_a->data();   // activations[S] for the neurons in this layer
        
        while( input < inEnd ) {
            *output++ = tanh( *input++ );
        }
        return true;
    }